

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadTorus.cpp
# Opt level: O2

void pzgeom::TPZQuadTorus::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  TPZGeoNode *this;
  TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *this_00;
  long lVar4;
  TPZManVector<long,_4> indexes;
  TPZManVector<double,_3> origin;
  TPZManVector<double,_2> loc;
  TPZFNMatrix<12,_double> phitheta;
  TPZManVector<double,_3> xco;
  TPZQuadTorus local_1d0;
  
  pdVar3 = size->fStore;
  *pdVar3 = 2.0;
  pdVar3[1] = 2.0;
  pdVar3[2] = 1.0;
  TPZManVector<double,_3>::TPZManVector(&origin,lowercorner);
  *origin.super_TPZVec<double>.fStore = *origin.super_TPZVec<double>.fStore + 1.0;
  local_1d0.super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.
  super_TPZQuadrilateral.super_TPZSavable._vptr_TPZSavable = (TPZSavable)(_func_int **)0x0;
  TPZFNMatrix<12,_double>::TPZFNMatrix(&phitheta,2,4,(double *)&local_1d0);
  pdVar3 = TPZFMatrix<double>::operator()(&phitheta.super_TPZFMatrix<double>,0,0);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(&phitheta.super_TPZFMatrix<double>,1,0);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(&phitheta.super_TPZFMatrix<double>,0,1);
  *pdVar3 = 1.0471975511965976;
  pdVar3 = TPZFMatrix<double>::operator()(&phitheta.super_TPZFMatrix<double>,1,1);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(&phitheta.super_TPZFMatrix<double>,0,2);
  *pdVar3 = 1.0471975511965976;
  pdVar3 = TPZFMatrix<double>::operator()(&phitheta.super_TPZFMatrix<double>,1,2);
  *pdVar3 = 3.141592653589793;
  pdVar3 = TPZFMatrix<double>::operator()(&phitheta.super_TPZFMatrix<double>,0,3);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(&phitheta.super_TPZFMatrix<double>,1,3);
  *pdVar3 = 3.141592653589793;
  TPZQuadTorus(&local_1d0);
  SetOrigin(&local_1d0,&origin.super_TPZVec<double>);
  local_1d0.fR = 1.0;
  local_1d0.fr = 0.8;
  TPZFMatrix<double>::operator=
            (&local_1d0.fPhiTheta.super_TPZFMatrix<double>,&phitheta.super_TPZFMatrix<double>);
  TPZManVector<long,_4>::TPZManVector(&indexes,4);
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 8) {
    iVar2 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(&gmesh->fNodeVec);
    *(long *)((long)indexes.super_TPZVec<long>.fStore + lVar4) = (long)iVar2;
    TPZManVector<double,_3>::TPZManVector(&xco,3);
    TPZManVector<double,_2>::TPZManVector(&loc,2);
    dVar1 = *(double *)(&UNK_01305b58 + lVar4 * 2);
    *loc.super_TPZVec<double>.fStore = *(double *)(&DAT_01305b50 + lVar4 * 2);
    loc.super_TPZVec<double>.fStore[1] = dVar1;
    X<double>(&local_1d0,&phitheta.super_TPZFMatrix<double>,&loc.super_TPZVec<double>,
              &xco.super_TPZVec<double>);
    this = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,
                      *(int64_t *)((long)indexes.super_TPZVec<long>.fStore + lVar4));
    TPZGeoNode::Initialize(this,&xco.super_TPZVec<double>,gmesh);
    TPZManVector<double,_2>::~TPZManVector(&loc);
    TPZManVector<double,_3>::~TPZManVector(&xco);
  }
  this_00 = (TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *)operator_new(0x2e0);
  TPZGeoElRefPattern<pzgeom::TPZQuadTorus>::TPZGeoElRefPattern
            (this_00,&indexes.super_TPZVec<long>,matid,gmesh);
  SetOrigin(&(this_00->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).fGeo,
            &origin.super_TPZVec<double>);
  (this_00->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).fGeo.fR = 1.0;
  (this_00->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).fGeo.fr = 0.8;
  TPZFMatrix<double>::operator=
            (&(this_00->super_TPZGeoElRefLess<pzgeom::TPZQuadTorus>).fGeo.fPhiTheta.
              super_TPZFMatrix<double>,&phitheta.super_TPZFMatrix<double>);
  TPZManVector<long,_4>::~TPZManVector(&indexes);
  ~TPZQuadTorus(&local_1d0);
  TPZFNMatrix<12,_double>::~TPZFNMatrix(&phitheta);
  TPZManVector<double,_3>::~TPZManVector(&origin);
  return;
}

Assistant:

void pzgeom::TPZQuadTorus::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
    {
        REAL R = 1., r = 0.8;
        size[0] = 2.;
        size[1] = 2.;
        size[2] = 1.;
        TPZManVector<REAL,3> origin(lowercorner);
        origin[0] += 1.;        
        TPZFNMatrix<12,REAL> phitheta(2,4,0.);
        phitheta(0,0) = 0.;
        phitheta(1,0) = 0;
        
        phitheta(0,1) = M_PI/3;
        phitheta(1,1) = 0;
        
        phitheta(0,2) = M_PI/3;
        phitheta(1,2) = M_PI;
        
        phitheta(0,3) = 0.;
        phitheta(1,3) = M_PI;

        TPZQuadTorus torus;
        torus.SetOrigin(origin);
        torus.SetDataRadius(R, r);
        torus.SetDataPhiTheta(phitheta);
        TPZManVector<int64_t,4> indexes(4);
        constexpr REAL coords[4][2] = {
            {-1,-1},{1,-1},{1,1},{-1,1}
        };
        for (int i=0; i<4; i++) {
            indexes[i] = gmesh.NodeVec().AllocateNewElement();
            TPZManVector<REAL,3> xco(3);
            TPZManVector<REAL, 2>loc(2);
            loc[0] = coords[i][0];
            loc[1] = coords[i][1];
            torus.X(phitheta, loc, xco);
            gmesh.NodeVec()[indexes[i]].Initialize(xco, gmesh);
        }
        TPZGeoElRefPattern<pzgeom::TPZQuadTorus> *gel = new TPZGeoElRefPattern<pzgeom::TPZQuadTorus>(indexes,matid,gmesh);
        gel->Geom().SetOrigin(origin);
        gel->Geom().SetDataRadius(R, r);
        gel->Geom().SetDataPhiTheta(phitheta);
    }